

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseExpansion(Parser *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  regex *in_RSI;
  Parser *in_RDI;
  shared_ptr<minja::Expression> sVar4;
  shared_ptr<minja::Expression> expr;
  string op_str;
  Parser *in_stack_00000678;
  shared_ptr<minja::Expression> *in_stack_ffffffffffffff58;
  Parser *__lhs;
  Op *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  flag_type in_stack_ffffffffffffff94;
  Location *in_stack_ffffffffffffff98;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  __shared_ptr local_50 [16];
  string local_40 [44];
  SpaceHandling in_stack_ffffffffffffffec;
  Parser *this_01;
  
  __lhs = in_RDI;
  this_01 = in_RDI;
  if (parseExpansion()::expansion_tok_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&parseExpansion()::expansion_tok_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff94);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseExpansion()::expansion_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseExpansion()::expansion_tok_abi_cxx11_);
    }
  }
  consumeToken(this_01,in_RSI,in_stack_ffffffffffffffec);
  parseValueExpression(in_stack_00000678);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_50);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Expected expr of \'expansion\' expression");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    get_location((Parser *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                    (char *)in_stack_ffffffffffffff58);
    std::
    make_shared<minja::UnaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,minja::UnaryOpExpr::Op>
              (in_stack_ffffffffffffff98,
               (shared_ptr<minja::Expression> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    std::shared_ptr<minja::Expression>::shared_ptr<minja::UnaryOpExpr,void>
              ((shared_ptr<minja::Expression> *)__lhs,
               (shared_ptr<minja::UnaryOpExpr> *)in_stack_ffffffffffffff58);
    std::shared_ptr<minja::UnaryOpExpr>::~shared_ptr((shared_ptr<minja::UnaryOpExpr> *)0x2eefcf);
    Location::~Location((Location *)0x2eefd9);
  }
  else {
    std::shared_ptr<minja::Expression>::shared_ptr
              ((shared_ptr<minja::Expression> *)__lhs,in_stack_ffffffffffffff58);
  }
  std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2ef00d);
  std::__cxx11::string::~string(local_40);
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<minja::Expression>)
         sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseExpansion() {
      static std::regex expansion_tok(R"(\*\*?)");
      auto op_str = consumeToken(expansion_tok);
      auto expr = parseValueExpression();
      if (op_str.empty()) return expr;
      if (!expr) throw std::runtime_error("Expected expr of 'expansion' expression");
      return std::make_shared<UnaryOpExpr>(get_location(), std::move(expr), op_str == "*" ? UnaryOpExpr::Op::Expansion : UnaryOpExpr::Op::ExpansionDict);
    }